

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int autotest(void)

{
  Vector *first;
  Vector *other;
  int iVar1;
  VectorHori v4;
  VectorHori v3;
  
  first = (Vector *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v4,"Test.txt",(allocator<char> *)&v3);
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)first,(string *)&v4,0x49);
  std::__cxx11::string::~string((string *)&v4);
  other = (Vector *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v4,"Test.txt",(allocator<char> *)&v3);
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)other,(string *)&v4,0x39);
  std::__cxx11::string::~string((string *)&v4);
  VECTOR_HORI_VERT::operator-(&v4,first,other);
  VECTOR_HORI_VERT::operator+(&v3,first,other);
  if ((((*v3.super_Vector.vector_ != 1) || (v3.super_Vector.vector_[1] != 3)) ||
      (v3.super_Vector.vector_[2] != 0)) ||
     (((v3.super_Vector.L != 3 || (*v4.super_Vector.vector_ != 1)) ||
      ((v4.super_Vector.vector_[1] != 6 || (iVar1 = 0, v4.super_Vector.L != 2)))))) {
    VECTOR_HORI_VERT::VectorHori::Output(&v4);
    iVar1 = 1;
  }
  (*other->_vptr_Vector[2])(other);
  (*first->_vptr_Vector[2])(first);
  VECTOR_HORI_VERT::VectorHori::~VectorHori(&v3);
  VECTOR_HORI_VERT::VectorHori::~VectorHori(&v4);
  return iVar1;
}

Assistant:

int autotest(){
    try
    {
    Vector* v1=new VectorHori("Test.txt",73);
    Vector* v2=new VectorHori("Test.txt",57);
    VectorHori v4=*v1-*v2;
    VectorHori v3=*v1+*v2;
    if ( (v3.vector_[0]==1) && (v3.vector_[1]==3) && (v3.vector_[2]==0) && (v3.L==3)
      && (v4.vector_[0]==1) && (v4.vector_[1]==6) && (v4.L==2) ){
        delete v2;
        delete v1;
        return 0;
    }else{
        v4.Output();
        delete v2;
        delete v1;
        return 1;
    }
    }
    catch (const std::exception& e) {
        std::cerr << e.what() << std::endl;
        return -1;
    }
}